

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_get_info.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_108 [8];
  option long_options [6];
  int opt;
  size_t len;
  char *algo;
  char *pcStack_20;
  int cost;
  char *hash;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  pcStack_20 = (char *)0x0;
  algo._4_4_ = 0;
  len = 0;
  hash = (char *)argv;
  argv_local._0_4_ = argc;
  memcpy(local_108,&PTR_anon_var_dwarf_23_0010bd10,0xc0);
  msgno = 0;
  do {
    iVar1 = getopt_long((int)argv_local,hash,"h:vVH",local_108,0);
    if (iVar1 == -1) {
      iVar1 = password_get_info(pcStack_20,(char **)&len,(int *)((long)&algo + 4));
      if (iVar1 == 0) {
        printf("algorithm = %s\n",len);
        printf("cost = %d\n",(ulong)algo._4_4_);
      }
      return 0;
    }
    switch(iVar1) {
    case 0x48:
    default:
      usage(*(char **)hash);
      return -1;
    case 0x56:
      printf("PHP Password Hashing version: %d.%d.%d\n",0,1);
      return 0;
    case 0x68:
      pcStack_20 = _optarg;
      break;
    case 0x71:
      msgno = -1;
      break;
    case 0x76:
      if (_optarg == (char *)0x0) {
        msgno = msgno + 1;
      }
      else {
        msgno = atoi(_optarg);
      }
    }
  } while( true );
}

Assistant:

int
main(int argc, char **argv)
{
    char *hash = NULL;
    int cost = 0;
    char *algo = NULL;
    size_t len;

    int opt;
    const struct option long_options[] = {
        { "hash", 1, NULL, 'h' },
        { "verbose", 1, NULL, 'v' },
        { "quiet", 0, NULL, 'q' },
        { "version", 0, NULL, 'V' },
        { "help", 0, NULL, 'H' },
        { NULL, 0, NULL, 0 }
    };

    msgno = 0;

    while ((opt = getopt_long(argc, argv, "h:vVH",
                              long_options, NULL)) != -1) {
        switch (opt) {
            case 'h':
                hash = optarg;
                break;
            case 'v':
                if (optarg) {
                    msgno = atoi(optarg);
                } else {
                    msgno += 1;
                }
                break;
            case 'q':
                msgno = -1;
                break;
            case 'V':
                printf("PHP Password Hashing version: %d.%d.%d\n",
                       PHP_PASSWORD_VERSION_MAJOR,
                       PHP_PASSWORD_VERSION_MINOR,
                       PHP_PASSWORD_VERSION_BUILD);
                return 0;
            case 'H':
            default:
                usage(argv[0]);
                return -1;
        }
    }

    if (password_get_info(hash, &algo, &cost) == 0) {
        printf("algorithm = %s\n", algo);
        printf("cost = %d\n", cost);
    }

    return 0;
}